

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::flip31(tetgenmesh *this,face *flipfaces,int flipflag)

{
  int iVar1;
  verttype vVar2;
  point pdVar3;
  point pdVar4;
  point pointptr;
  shellface ppdVar5;
  double value;
  face *local_170;
  face *local_158;
  face *local_140;
  face *local_120;
  int local_114;
  int i;
  point pc;
  point pb;
  point pa;
  face checkface;
  face bdsegs [3];
  face infaces [3];
  face outfaces [3];
  face bdedges [3];
  int flipflag_local;
  face *flipfaces_local;
  tetgenmesh *this_local;
  
  local_120 = (face *)&outfaces[2].shver;
  do {
    face::face(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != (face *)&bdedges[2].shver);
  local_140 = (face *)&infaces[2].shver;
  do {
    face::face(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != (face *)&outfaces[2].shver);
  local_158 = (face *)&bdsegs[2].shver;
  do {
    face::face(local_158);
    local_158 = local_158 + 1;
  } while (local_158 != (face *)&infaces[2].shver);
  local_170 = (face *)&checkface.shver;
  do {
    face::face(local_170);
    local_170 = local_170 + 1;
  } while (local_170 != (face *)&bdsegs[2].shver);
  face::face((face *)&pa);
  pdVar3 = sdest(this,flipfaces);
  pdVar4 = sdest(this,flipfaces + 1);
  pointptr = sdest(this,flipfaces + 2);
  this->flip31count = this->flip31count + 1;
  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
    senext(this,flipfaces + local_114,(face *)&outfaces[(long)local_114 + 2].shver);
    spivot(this,(face *)&outfaces[(long)local_114 + 2].shver,
           (face *)&infaces[(long)local_114 + 2].shver);
    face::operator=((face *)&bdsegs[(long)local_114 + 2].shver,
                    (face *)&infaces[(long)local_114 + 2].shver);
    sspivot(this,(face *)&outfaces[(long)local_114 + 2].shver,
            (face *)&bdsegs[(long)local_114 + -1].shver);
    if ((*(long *)&infaces[(long)local_114 + 2].shver != 0) &&
       (*(long *)(*(long *)&outfaces[(long)local_114 + 2].shver +
                 (long)((*(int *)&bdedges[local_114].sh >> 1) + 6) * 8) != 0)) {
      spivot(this,(face *)&bdsegs[(long)local_114 + 2].shver,(face *)&pa);
      while (pa != *(point *)&outfaces[(long)local_114 + 2].shver) {
        face::operator=((face *)&bdsegs[(long)local_114 + 2].shver,(face *)&pa);
        spivot(this,(face *)&bdsegs[(long)local_114 + 2].shver,(face *)&pa);
      }
    }
  }
  makeshellface(this,this->subfaces,flipfaces + 3);
  setsorg(this,flipfaces + 3,pdVar3);
  setsdest(this,flipfaces + 3,pdVar4);
  setsapex(this,flipfaces + 3,pointptr);
  iVar1 = shellmark(this,flipfaces);
  setshellmark(this,flipfaces + 3,iVar1);
  if (this->checkconstraints != 0) {
    value = areabound(this,flipfaces);
    setareabound(this,flipfaces + 3,value);
  }
  if (this->useinsertradius != 0) {
    iVar1 = getfacetindex(this,flipfaces);
    setfacetindex(this,flipfaces + 3,iVar1);
  }
  vVar2 = pointtype(this,pdVar3);
  if (vVar2 == FREEFACETVERTEX) {
    ppdVar5 = sencode(this,flipfaces + 3);
    setpoint2sh(this,pdVar3,ppdVar5);
  }
  vVar2 = pointtype(this,pdVar4);
  if (vVar2 == FREEFACETVERTEX) {
    ppdVar5 = sencode(this,flipfaces + 3);
    setpoint2sh(this,pdVar4,ppdVar5);
  }
  vVar2 = pointtype(this,pointptr);
  if (vVar2 == FREEFACETVERTEX) {
    ppdVar5 = sencode(this,flipfaces + 3);
    setpoint2sh(this,pointptr,ppdVar5);
  }
  face::operator=((face *)&outfaces[2].shver,flipfaces + 3);
  senext(this,flipfaces + 3,(face *)&bdedges[0].shver);
  senext2(this,flipfaces + 3,(face *)&bdedges[1].shver);
  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
    if (*(long *)&infaces[(long)local_114 + 2].shver != 0) {
      if (*(long *)&bdsegs[(long)local_114 + -1].shver != 0) {
        *(undefined4 *)&bdsegs[local_114].sh = 0;
        pdVar3 = sorg(this,(face *)&outfaces[(long)local_114 + 2].shver);
        pdVar4 = sorg(this,(face *)&bdsegs[(long)local_114 + -1].shver);
        if (pdVar3 != pdVar4) {
          sesymself(this,(face *)&outfaces[(long)local_114 + 2].shver);
        }
      }
      sbond1(this,(face *)&outfaces[(long)local_114 + 2].shver,
             (face *)&infaces[(long)local_114 + 2].shver);
      sbond1(this,(face *)&bdsegs[(long)local_114 + 2].shver,
             (face *)&outfaces[(long)local_114 + 2].shver);
    }
    if (*(long *)&bdsegs[(long)local_114 + -1].shver != 0) {
      ssbond(this,(face *)&outfaces[(long)local_114 + 2].shver,
             (face *)&bdsegs[(long)local_114 + -1].shver);
    }
  }
  face::operator=(&this->recentsh,flipfaces + 3);
  if (flipflag != 0) {
    for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
      flipshpush(this,(face *)&outfaces[(long)local_114 + 2].shver);
    }
  }
  return;
}

Assistant:

void tetgenmesh::flip31(face* flipfaces, int flipflag)
{
  face bdedges[3], outfaces[3], infaces[3];
  face bdsegs[3];
  face checkface;
  point pa, pb, pc;
  int i;

  pa = sdest(flipfaces[0]);
  pb = sdest(flipfaces[1]);
  pc = sdest(flipfaces[2]);

  flip31count++;

  // Collect all infos at the three boundary edges.
  for (i = 0; i < 3; i++) {
    senext(flipfaces[i], bdedges[i]);
    spivot(bdedges[i], outfaces[i]);
    infaces[i] = outfaces[i];
    sspivot(bdedges[i], bdsegs[i]);
    if (outfaces[i].sh != NULL) {
      if (isshsubseg(bdedges[i])) {
        spivot(infaces[i], checkface);
        while (checkface.sh != bdedges[i].sh) {
          infaces[i] = checkface;
          spivot(infaces[i], checkface);
        }
      }
    }
  } // i

  // Create a new subface.
  makeshellface(subfaces, &(flipfaces[3]));
  setshvertices(flipfaces[3], pa, pb,pc);
  setshellmark(flipfaces[3], shellmark(flipfaces[0]));
  if (checkconstraints) {
    //area = areabound(flipfaces[0]);
    setareabound(flipfaces[3], areabound(flipfaces[0]));
  }
  if (useinsertradius) {
    setfacetindex(flipfaces[3], getfacetindex(flipfaces[0]));
  }

  // Update the point-to-subface map.
  if (pointtype(pa) == FREEFACETVERTEX) {
    setpoint2sh(pa, sencode(flipfaces[3]));
  }
  if (pointtype(pb) == FREEFACETVERTEX) {
    setpoint2sh(pb, sencode(flipfaces[3]));
  }
  if (pointtype(pc) == FREEFACETVERTEX) {
    setpoint2sh(pc, sencode(flipfaces[3]));
  }

  // Update the three new boundary edges.
  bdedges[0] = flipfaces[3];         // [a,b]
  senext(flipfaces[3], bdedges[1]);  // [b,c]
  senext2(flipfaces[3], bdedges[2]); // [c,a]

  // Reconnect boundary edges to outer boundary faces.
  for (i = 0; i < 3; i++) {
    if (outfaces[i].sh != NULL) {
      // Make sure that the subface has the ori as the segment.
      if (bdsegs[i].sh != NULL) {
        bdsegs[i].shver = 0;
        if (sorg(bdedges[i]) != sorg(bdsegs[i])) {
          sesymself(bdedges[i]);
        }
      }
      sbond1(bdedges[i], outfaces[i]);
      sbond1(infaces[i], bdedges[i]);
    }
    if (bdsegs[i].sh != NULL) {
      ssbond(bdedges[i], bdsegs[i]);
    }
  }

  recentsh = flipfaces[3];

  if (flipflag) {
    // Put the boundary edges into flip stack.
    for (i = 0; i < 3; i++) {
      flipshpush(&(bdedges[i]));
    }
  }
}